

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_pixel_format.h
# Opt level: O0

bool crnlib::pixel_format_helpers::is_crn_format_non_srgb(crn_format fmt)

{
  crn_format fmt_local;
  
  return (ulong)(fmt + ~cCRNFmtDXT5) < 7;
}

Assistant:

inline bool is_crn_format_non_srgb(crn_format fmt) {
  switch (fmt) {
    case cCRNFmtDXN_XY:
    case cCRNFmtDXN_YX:
    case cCRNFmtDXT5A:
    case cCRNFmtDXT5_CCxY:
    case cCRNFmtDXT5_xGxR:
    case cCRNFmtDXT5_xGBR:
    case cCRNFmtDXT5_AGBR:
      return true;
    default:
      break;
  }
  return false;
}